

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O0

Sfm_Tim_t * Sfm_TimStart(Mio_Library_t *pLib,Scl_Con_t *pExt,Abc_Ntk_t *pNtk,int DeltaCrit)

{
  int iVar1;
  Sfm_Tim_t *p_00;
  Sfm_Tim_t *p;
  int DeltaCrit_local;
  Abc_Ntk_t *pNtk_local;
  Scl_Con_t *pExt_local;
  Mio_Library_t *pLib_local;
  
  p_00 = (Sfm_Tim_t *)calloc(1,0x70);
  p_00->pLib = pLib;
  p_00->pExt = pExt;
  p_00->pNtk = pNtk;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Vec_IntFill(&p_00->vTimArrs,iVar1 * 3,0);
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Vec_IntFill(&p_00->vTimReqs,iVar1 * 3,0);
  iVar1 = Sfm_TimTrace(p_00);
  p_00->Delay = iVar1;
  if (0 < DeltaCrit) {
    iVar1 = Scl_Flt2Int(1000.0);
    if (DeltaCrit < iVar1) {
      p_00->DeltaCrit = DeltaCrit;
      return p_00;
    }
  }
  __assert_fail("DeltaCrit > 0 && DeltaCrit < Scl_Flt2Int(1000.0)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sfm/sfmTim.c"
                ,0xee,"Sfm_Tim_t *Sfm_TimStart(Mio_Library_t *, Scl_Con_t *, Abc_Ntk_t *, int)");
}

Assistant:

Sfm_Tim_t * Sfm_TimStart( Mio_Library_t * pLib, Scl_Con_t * pExt, Abc_Ntk_t * pNtk, int DeltaCrit )
{
    Sfm_Tim_t * p = ABC_CALLOC( Sfm_Tim_t, 1 );
    p->pLib = pLib;
    p->pExt = pExt;
    p->pNtk = pNtk;
    Vec_IntFill( &p->vTimArrs,  3*Abc_NtkObjNumMax(pNtk), 0 );
    Vec_IntFill( &p->vTimReqs,  3*Abc_NtkObjNumMax(pNtk), 0 );
    p->Delay = Sfm_TimTrace( p );
    assert( DeltaCrit > 0 && DeltaCrit < Scl_Flt2Int(1000.0) );
    p->DeltaCrit = DeltaCrit;
    return p;
}